

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

ssize_t readn(int fd,string *inBuffer)

{
  int *piVar1;
  int in_EDI;
  char buff [4096];
  ssize_t readSum;
  ssize_t nread;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> *__a;
  char *in_stack_ffffffffffffefa0;
  char *in_stack_ffffffffffffefa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1028 [128];
  long local_28;
  ssize_t local_20;
  int local_c;
  long local_8;
  
  local_20 = 0;
  local_28 = 0;
  local_c = in_EDI;
  while( true ) {
    while (local_20 = read(local_c,local_1028,0x1000), local_20 < 0) {
      piVar1 = __errno_location();
      if (*piVar1 != 4) {
        piVar1 = __errno_location();
        if (*piVar1 == 0xb) {
          local_8 = local_28;
        }
        else {
          perror("read error");
          local_8 = -1;
        }
        return local_8;
      }
    }
    if (local_20 == 0) break;
    local_28 = local_28 + local_20;
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&local_1028[0]._M_dataplus._M_p + local_20);
    __a = (allocator<char> *)&stack0xffffffffffffefb7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char*,void>
              (in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,__a);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,in_stack_ffffffffffffef88);
    std::__cxx11::string::~string(this);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffefb7);
  }
  return local_28;
}

Assistant:

ssize_t readn(int fd, std::string &inBuffer){
    ssize_t nread=0;
    ssize_t readSum=0;

    while (true) {
        char buff[MAX_BUFF];
        if ((nread=read(fd, buff, MAX_BUFF))<0) {
            if(errno==EINTR){
                continue;
            }else if (errno==EAGAIN) {
                return readSum;
            }else {
                perror("read error");
                return -1;
            }
        }else if (nread==0) {
            break;
        }
        // printf("before inBuffer.size() = %d\n", inBuffer.size());
        // printf("nread = %d\n", nread);
        readSum+=nread;
        // buff += nread;
        inBuffer+=std::string(buff, buff+nread);
        // printf("after inBuffer.size() = %d\n", inBuffer.size());
    }
    return readSum;
}